

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::descriptor_unittest::FeaturesTest_ValidExtensionFieldImplicitDefault_Test::
~FeaturesTest_ValidExtensionFieldImplicitDefault_Test
          (FeaturesTest_ValidExtensionFieldImplicitDefault_Test *this)

{
  ValidationErrorTest::~ValidationErrorTest((ValidationErrorTest *)this);
  operator_delete(this,0x88);
  return;
}

Assistant:

TEST_F(FeaturesTest, ValidExtensionFieldImplicitDefault) {
  BuildDescriptorMessagesInTestPool();
  const FileDescriptor* file = BuildFile(
      R"pb(
        name: "foo.proto"
        syntax: "editions"
        edition: EDITION_2023
        options { features { field_presence: IMPLICIT } }
        message_type {
          name: "Foo"
          extension_range { start: 1 end: 100 }
        }
        extension {
          name: "bar"
          number: 1
          label: LABEL_OPTIONAL
          type: TYPE_STRING
          default_value: "Hello world"
          extendee: "Foo"
        }
      )pb");
  ASSERT_THAT(file, NotNull());

  EXPECT_TRUE(file->extension(0)->has_presence());
  EXPECT_EQ(file->extension(0)->default_value_string(), "Hello world");
}